

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

int fn_emit(Function *fn,BcIns ins)

{
  int iVar1;
  BcIns *__ptr;
  
  __ptr = fn->ins;
  if (__ptr == (BcIns *)0x0) {
    fn->ins_capacity = 0x20;
    __ptr = (BcIns *)malloc(0x80);
  }
  else {
    iVar1 = fn->ins_capacity;
    if (fn->ins_count < iVar1) goto LAB_0010e00f;
    fn->ins_capacity = iVar1 * 2;
    __ptr = (BcIns *)realloc(__ptr,(long)iVar1 << 3);
  }
  fn->ins = __ptr;
LAB_0010e00f:
  iVar1 = fn->ins_count;
  fn->ins_count = iVar1 + 1;
  __ptr[iVar1] = ins;
  return fn->ins_count + -1;
}

Assistant:

int fn_emit(Function *fn, BcIns ins) {
	if (fn->ins == NULL) {
		// Lazily instantiate the bytecode array
		fn->ins_capacity = 32;
		fn->ins = malloc(sizeof(BcIns) * fn->ins_capacity);
	} else if (fn->ins_count >= fn->ins_capacity) {
		// Increase the capacity of the bytecode array
		fn->ins_capacity *= 2;
		fn->ins = realloc(fn->ins, sizeof(BcIns) * fn->ins_capacity);
	}

	fn->ins[fn->ins_count++] = ins;
	return fn->ins_count - 1;
}